

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O1

bool __thiscall
node::BlockManager::WriteUndoDataForBlock
          (BlockManager *this,CBlockUndo *blockundo,BlockValidationState *state,CBlockIndex *block)

{
  int iVar1;
  int iVar2;
  uint256 *puVar3;
  Notifications *notifications;
  string_view source_file;
  bool bVar4;
  optional<node::BlockfileCursor> *poVar5;
  Logger *pLVar6;
  byte bVar7;
  uint nFile;
  LogFlags in_R9;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file_00;
  string_view str;
  string_view logging_function_00;
  FlatFilePos _pos;
  string log_msg;
  Level in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  int *in_stack_fffffffffffffed8;
  FlatFilePos local_104;
  undefined1 local_f8 [16];
  undefined1 local_e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8 [7];
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = block->nHeight;
  bVar4 = (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged;
  iVar2 = (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_payload._M_value;
  local_f8._8_8_ = local_f8._8_8_ & 0xffffffffffffff00;
  local_f8._0_8_ = this;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_f8);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_f8);
  poVar5 = inline_assertion_check<true,std::optional<node::BlockfileCursor>&>
                     ((this->m_blockfile_cursors)._M_elems + (byte)(bVar4 & iVar2 <= iVar1),
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
                      ,999,"WriteUndoDataForBlock",
                      "WITH_LOCK(cs_LastBlockFile, return m_blockfile_cursors[type])");
  nFile = block->nFile;
  if (nFile == 0xffffffff || (block->nStatus & 0x10) == 0) {
    local_104.nFile = -1;
    local_104.nPos = 0;
    local_f8._0_8_ = (BlockManager *)0x0;
    VectorFormatter<DefaultFormatter>::
    Ser<SizeComputer,std::vector<CTxUndo,std::allocator<CTxUndo>>>
              ((VectorFormatter<DefaultFormatter> *)&local_58,(SizeComputer *)local_f8,
               &blockundo->vtxundo);
    bVar4 = FindUndoPos(this,state,nFile,&local_104,local_f8._0_4_ + 0x28);
    if (bVar4) {
      puVar3 = block->pprev->phashBlock;
      if (puVar3 == (uint256 *)0x0) {
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      local_f8._0_8_ = *(undefined8 *)(puVar3->super_base_blob<256U>).m_data._M_elems;
      local_f8._8_8_ = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
      local_e8._0_8_ = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
      local_e8._8_8_ = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18);
      bVar4 = UndoWriteToDisk(this,blockundo,&local_104,(uint256 *)local_f8);
      if (bVar4) {
        iVar1 = (poVar5->super__Optional_base<node::BlockfileCursor,_true,_true>)._M_payload.
                super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.file_num;
        if ((local_104.nFile < iVar1) &&
           (block->nHeight ==
            (this->m_blockfile_info).
            super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
            super__Vector_impl_data._M_start[local_104.nFile].nHeightLast)) {
          bVar4 = FlushUndoFile(this,local_104.nFile,true);
          if (!bVar4) {
            pLVar6 = LogInstance();
            bVar4 = BCLog::Logger::WillLogCategoryLevel(pLVar6,BLOCKSTORAGE,Warning);
            if (bVar4) {
              logging_function._M_str = "WriteUndoDataForBlock";
              logging_function._M_len = 0x15;
              source_file_00._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
              ;
              source_file_00._M_len = 0x5e;
              LogPrintf_<int>(logging_function,source_file_00,(int)&local_104,in_R9,
                              in_stack_fffffffffffffec8,in_stack_fffffffffffffed0,
                              in_stack_fffffffffffffed8);
            }
          }
        }
        else if ((local_104.nFile == iVar1) &&
                ((poVar5->super__Optional_base<node::BlockfileCursor,_true,_true>)._M_payload.
                 super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.undo_height
                 < block->nHeight)) {
          (poVar5->super__Optional_base<node::BlockfileCursor,_true,_true>)._M_payload.
          super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.undo_height =
               block->nHeight;
        }
        block->nUndoPos = local_104.nPos;
        *(byte *)&block->nStatus = (byte)block->nStatus | 0x10;
        local_f8._0_8_ = block;
        std::
        _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
        ::_M_insert_unique<CBlockIndex*>
                  ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                    *)&this->m_dirty_blockindex,(CBlockIndex **)local_f8);
        bVar4 = true;
      }
      else {
        notifications = (this->m_opts).notifications;
        local_f8._0_8_ = (BlockManager *)local_e8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_f8,"Failed to write undo data.","");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_e8._16_8_ = local_c8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_e8 + 0x10),"Failed to write undo data.","");
        }
        else {
          local_58._M_dataplus._M_p = "Failed to write undo data.";
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_e8 + 0x10),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_58
                    );
        }
        bVar4 = FatalError(notifications,state,(bilingual_str *)local_f8);
        nFile = (uint)bVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._16_8_ != local_c8) {
          operator_delete((void *)local_e8._16_8_,(ulong)(local_c8[0]._M_allocated_capacity + 1));
        }
        if ((BlockManager *)local_f8._0_8_ != (BlockManager *)local_e8) {
          operator_delete((void *)local_f8._0_8_,local_e8._0_8_ + 1);
        }
        bVar4 = false;
      }
    }
    else {
      pLVar6 = LogInstance();
      bVar4 = BCLog::Logger::Enabled(pLVar6);
      if (bVar4) {
        local_f8._8_8_ = 0;
        local_e8._0_8_ = local_e8._0_8_ & 0xffffffffffffff00;
        local_f8._0_8_ = (BlockManager *)local_e8;
        tinyformat::format<char[22]>
                  (&local_58,"%s: FindUndoPos failed\n",(char (*) [22])"WriteUndoDataForBlock");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   &local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        pLVar6 = LogInstance();
        local_58._M_dataplus._M_p = (char *)0x5e;
        local_58._M_string_length = 0x814f19;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
        ;
        source_file._M_len = 0x5e;
        str._M_str = (char *)local_f8._0_8_;
        str._M_len = local_f8._8_8_;
        logging_function_00._M_str = "WriteUndoDataForBlock";
        logging_function_00._M_len = 0x15;
        BCLog::Logger::LogPrintStr(pLVar6,str,logging_function_00,source_file,0x3ed,ALL,Error);
        if ((BlockManager *)local_f8._0_8_ != (BlockManager *)local_e8) {
          operator_delete((void *)local_f8._0_8_,local_e8._0_8_ + 1);
        }
      }
      bVar4 = false;
      nFile = 0;
    }
    bVar7 = (byte)nFile;
    if (!bVar4) goto LAB_0021266d;
  }
  bVar7 = 1;
LAB_0021266d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(bVar7 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::WriteUndoDataForBlock(const CBlockUndo& blockundo, BlockValidationState& state, CBlockIndex& block)
{
    AssertLockHeld(::cs_main);
    const BlockfileType type = BlockfileTypeForHeight(block.nHeight);
    auto& cursor = *Assert(WITH_LOCK(cs_LastBlockFile, return m_blockfile_cursors[type]));

    // Write undo information to disk
    if (block.GetUndoPos().IsNull()) {
        FlatFilePos _pos;
        if (!FindUndoPos(state, block.nFile, _pos, ::GetSerializeSize(blockundo) + 40)) {
            LogError("%s: FindUndoPos failed\n", __func__);
            return false;
        }
        if (!UndoWriteToDisk(blockundo, _pos, block.pprev->GetBlockHash())) {
            return FatalError(m_opts.notifications, state, _("Failed to write undo data."));
        }
        // rev files are written in block height order, whereas blk files are written as blocks come in (often out of order)
        // we want to flush the rev (undo) file once we've written the last block, which is indicated by the last height
        // in the block file info as below; note that this does not catch the case where the undo writes are keeping up
        // with the block writes (usually when a synced up node is getting newly mined blocks) -- this case is caught in
        // the FindNextBlockPos function
        if (_pos.nFile < cursor.file_num && static_cast<uint32_t>(block.nHeight) == m_blockfile_info[_pos.nFile].nHeightLast) {
            // Do not propagate the return code, a failed flush here should not
            // be an indication for a failed write. If it were propagated here,
            // the caller would assume the undo data not to be written, when in
            // fact it is. Note though, that a failed flush might leave the data
            // file untrimmed.
            if (!FlushUndoFile(_pos.nFile, true)) {
                LogPrintLevel(BCLog::BLOCKSTORAGE, BCLog::Level::Warning, "Failed to flush undo file %05i\n", _pos.nFile);
            }
        } else if (_pos.nFile == cursor.file_num && block.nHeight > cursor.undo_height) {
            cursor.undo_height = block.nHeight;
        }
        // update nUndoPos in block index
        block.nUndoPos = _pos.nPos;
        block.nStatus |= BLOCK_HAVE_UNDO;
        m_dirty_blockindex.insert(&block);
    }

    return true;
}